

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::visitConstantUnion
          (TGlslangToSpvTraverser *this,TIntermConstantUnion *node)

{
  bool bVar1;
  int iVar2;
  Id rValue;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TConstUnionArray *consts;
  int local_1c;
  Id constant;
  int nextConst;
  TIntermConstantUnion *node_local;
  TGlslangToSpvTraverser *this_local;
  
  _constant = node;
  node_local = (TIntermConstantUnion *)this;
  iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
  bVar1 = glslang::TQualifier::isSpirvLiteral((TQualifier *)CONCAT44(extraout_var,iVar2));
  if (!bVar1) {
    local_1c = 0;
    iVar2 = (*(_constant->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    consts = glslang::TIntermConstantUnion::getConstArray(_constant);
    rValue = createSpvConstantFromConstUnionArray
                       (this,(TType *)CONCAT44(extraout_var_00,iVar2),consts,&local_1c,false);
    spv::Builder::clearAccessChain(&this->builder);
    spv::Builder::setAccessChainRValue(&this->builder,rValue);
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::visitConstantUnion(glslang::TIntermConstantUnion* node)
{
    if (node->getQualifier().isSpirvLiteral())
        return; // Translated to a literal value, skip further processing

    int nextConst = 0;
    spv::Id constant = createSpvConstantFromConstUnionArray(node->getType(), node->getConstArray(), nextConst, false);

    builder.clearAccessChain();
    builder.setAccessChainRValue(constant);
}